

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O0

TPZConnect * __thiscall
TPZInterpolatedElement::SideConnect(TPZInterpolatedElement *this,int connect,int side)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  ostream *this_00;
  TPZAdmChunkVector<TPZConnect,_10> *this_01;
  TPZConnect *pTVar3;
  int in_EDX;
  int in_ESI;
  TPZConnect *in_RDI;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  int64_t in_stack_ffffffffffffffd8;
  TPZChunkVector<TPZConnect,_10> *in_stack_ffffffffffffffe0;
  
  if ((-1 < in_EDX) && (-1 < in_ESI)) {
    pTVar2 = TPZCompEl::Reference((TPZCompEl *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
    iVar1 = (**(code **)(*(long *)pTVar2 + 0xf0))();
    if (in_EDX <= iVar1) {
      this_01 = TPZCompMesh::ConnectVec((TPZCompMesh *)in_RDI->fSequenceNumber);
      SideConnectIndex((TPZInterpolatedElement *)this_01,in_stack_ffffffffffffffbc,
                       in_stack_ffffffffffffffb8);
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      return pTVar3;
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,
                            "Exiting SideConnect - has bad first or second parameter.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if ((SideConnect(int,int)::con == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SideConnect(int,int)::con), iVar1 != 0)) {
    TPZConnect::TPZConnect(in_RDI);
    __cxa_atexit(TPZConnect::~TPZConnect,&SideConnect::con,&__dso_handle);
    __cxa_guard_release(&SideConnect(int,int)::con);
  }
  return &SideConnect::con;
}

Assistant:

TPZConnect &TPZInterpolatedElement::SideConnect(int connect, int side) {
    if (side < 0 || connect < 0 || side > Reference()->NSides()) {
        LOGPZ_ERROR(logger, "Exiting SideConnect - has bad first or second parameter.");
        static TPZConnect con;
        return con;
    }
    return (fMesh->ConnectVec()[SideConnectIndex(connect, side)]);
}